

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O0

void __thiscall StackTrace::set_read_write(StackTrace *this,size_t addr,size_t pc)

{
  bool bVar1;
  pointer prVar2;
  iterator iVar3;
  pair<unsigned_long,_unsigned_long> local_a8;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>::iterator,_bool>
  local_98;
  pair<unsigned_long,_unsigned_long> local_80;
  pair<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_> local_70;
  iterator local_58 [2];
  undefined1 local_38 [8];
  iterator it;
  lock_guard<ipc::spinlock> lg;
  size_t pc_local;
  size_t addr_local;
  StackTrace *this_local;
  
  lg._M_device = (mutex_type *)pc;
  pc_local = addr;
  addr_local = (size_t)this;
  std::lock_guard<ipc::spinlock>::lock_guard((lock_guard<ipc::spinlock> *)&it.field_1,&this->lock);
  iVar3 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                      *)this,&pc_local);
  it.ctrl_ = (ctrl_t *)iVar3.field_1;
  local_38 = (undefined1  [8])iVar3.ctrl_;
  local_58[0] = phmap::container_internal::
                raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                ::end((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                       *)this);
  bVar1 = phmap::container_internal::operator==((iterator *)local_38,local_58);
  if (bVar1) {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              (&local_80,(unsigned_long *)&lg,&this->_ce);
    std::pair<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>::pair<unsigned_long_&,_true>
              (&local_70,&pc_local,&local_80);
    phmap::container_internal::
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::insert(&local_98,
             (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)this,&local_70);
  }
  else {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              (&local_a8,(unsigned_long *)&lg,&this->_ce);
    prVar2 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::iterator::operator->((iterator *)local_38);
    std::pair<unsigned_long,_unsigned_long>::operator=(&prVar2->second,&local_a8);
  }
  std::lock_guard<ipc::spinlock>::~lock_guard((lock_guard<ipc::spinlock> *)&it.field_1);
  return;
}

Assistant:

void StackTrace::set_read_write(size_t addr, size_t pc) {
  std::lock_guard<ipc::spinlock> lg(lock);
  auto it = _read_write.find(addr);
  if (it == _read_write.end()) {
    _read_write.insert({addr, {pc, _ce}});
  } else {
    it->second = {pc, _ce};
  }
}